

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transupp.c
# Opt level: O0

void do_flatten(j_decompress_ptr srcinfo,j_compress_ptr dstinfo,JDIMENSION x_crop_offset,
               JDIMENSION y_crop_offset,jvirt_barray_ptr *src_coef_arrays,JDIMENSION drop_width,
               JDIMENSION drop_height)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  int in_R9D;
  jpeg_component_info *compptr;
  JBLOCKARRAY buffer;
  int average;
  int dc_right_value;
  int dc_left_value;
  int offset_y;
  int ci;
  JDIMENSION blk_x;
  JDIMENSION wipe_bottom;
  JDIMENSION y_wipe_blocks;
  JDIMENSION wipe_right;
  JDIMENSION wipe_width;
  JDIMENSION x_wipe_blocks;
  short local_50;
  int local_44;
  int local_40;
  uint local_3c;
  uint local_34;
  
  local_40 = 0;
  do {
    if (*(int *)(in_RSI + 0x4c) <= local_40) {
      return;
    }
    lVar5 = *(long *)(in_RSI + 0x58) + (long)local_40 * 0x60;
    uVar1 = in_EDX * *(int *)(lVar5 + 8);
    uVar2 = in_R9D * *(int *)(lVar5 + 8);
    uVar3 = uVar2 + uVar1;
    local_34 = in_ECX * *(int *)(lVar5 + 0xc);
    uVar4 = (int)compptr * *(int *)(lVar5 + 0xc) + local_34;
    for (; local_34 < uVar4; local_34 = *(int *)(lVar5 + 0xc) + local_34) {
      lVar6 = (**(code **)(*(long *)(in_RDI + 8) + 0x40))
                        (in_RDI,*(undefined8 *)(in_R8 + (long)local_40 * 8),local_34,
                         *(undefined4 *)(lVar5 + 0xc),1);
      for (local_44 = 0; local_44 < *(int *)(lVar5 + 0xc); local_44 = local_44 + 1) {
        memset((void *)(*(long *)(lVar6 + (long)local_44 * 8) + (ulong)uVar1 * 0x80),0,
               (ulong)uVar2 << 7);
        local_3c = uVar1;
        if (uVar1 == 0) {
          if (uVar3 < *(uint *)(lVar5 + 0x1c)) {
            local_50 = *(short *)(*(long *)(lVar6 + (long)local_44 * 8) + (ulong)uVar3 * 0x80);
            goto LAB_0011be87;
          }
        }
        else {
          local_50 = *(short *)(*(long *)(lVar6 + (long)local_44 * 8) + (ulong)(uVar1 - 1) * 0x80);
          if (uVar3 < *(uint *)(lVar5 + 0x1c)) {
            local_50 = (short)((int)local_50 +
                               (int)*(short *)(*(long *)(lVar6 + (long)local_44 * 8) +
                                              (ulong)uVar3 * 0x80) >> 1);
          }
LAB_0011be87:
          for (; local_3c < uVar3; local_3c = local_3c + 1) {
            *(short *)(*(long *)(lVar6 + (long)local_44 * 8) + (ulong)local_3c * 0x80) = local_50;
          }
        }
      }
    }
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

LOCAL(void)
do_flatten(j_decompress_ptr srcinfo, j_compress_ptr dstinfo,
           JDIMENSION x_crop_offset, JDIMENSION y_crop_offset,
           jvirt_barray_ptr *src_coef_arrays,
           JDIMENSION drop_width, JDIMENSION drop_height)
/* Flatten - discard image contents of specified region, similarly to wipe,
 * but fill with the average of adjacent blocks instead of zero.
 */
{
  JDIMENSION x_wipe_blocks, wipe_width, wipe_right;
  JDIMENSION y_wipe_blocks, wipe_bottom, blk_x;
  int ci, offset_y, dc_left_value, dc_right_value, average;
  JBLOCKARRAY buffer;
  jpeg_component_info *compptr;

  for (ci = 0; ci < dstinfo->num_components; ci++) {
    compptr = dstinfo->comp_info + ci;
    x_wipe_blocks = x_crop_offset * compptr->h_samp_factor;
    wipe_width = drop_width * compptr->h_samp_factor;
    wipe_right = wipe_width + x_wipe_blocks;
    y_wipe_blocks = y_crop_offset * compptr->v_samp_factor;
    wipe_bottom = drop_height * compptr->v_samp_factor + y_wipe_blocks;
    for (; y_wipe_blocks < wipe_bottom;
         y_wipe_blocks += compptr->v_samp_factor) {
      buffer = (*srcinfo->mem->access_virt_barray)
        ((j_common_ptr)srcinfo, src_coef_arrays[ci], y_wipe_blocks,
         (JDIMENSION)compptr->v_samp_factor, TRUE);
      for (offset_y = 0; offset_y < compptr->v_samp_factor; offset_y++) {
        MEMZERO(buffer[offset_y] + x_wipe_blocks, wipe_width * sizeof(JBLOCK));
        if (x_wipe_blocks > 0) {
          dc_left_value = buffer[offset_y][x_wipe_blocks - 1][0];
          if (wipe_right < compptr->width_in_blocks) {
            dc_right_value = buffer[offset_y][wipe_right][0];
            average = (dc_left_value + dc_right_value) >> 1;
          } else {
            average = dc_left_value;
          }
        } else if (wipe_right < compptr->width_in_blocks) {
          average = buffer[offset_y][wipe_right][0];
        } else continue;
        for (blk_x = x_wipe_blocks; blk_x < wipe_right; blk_x++) {
          buffer[offset_y][blk_x][0] = (JCOEF)average;
        }
      }
    }
  }
}